

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mlopl_io.cpp
# Opt level: O0

int __thiscall OPLio::OPLinit(OPLio *this,uint numchips,bool stereo,bool initopl3)

{
  int iVar1;
  OPLEmul *local_58;
  OPLEmul *local_50;
  OPLEmul *local_48;
  bool local_39;
  OPLEmul *chip;
  uint i;
  bool initopl3_local;
  bool stereo_local;
  uint numchips_local;
  OPLio *this_local;
  
  if (numchips == 0 || 8 < numchips) {
    __assert_fail("numchips >= 1 && numchips <= countof(chips)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/oplsynth/mlopl_io.cpp"
                  ,0x146,"virtual int OPLio::OPLinit(uint, bool, bool)");
  }
  local_39 = true;
  if ((current_opl_core != 1) && (local_39 = true, current_opl_core != 2)) {
    local_39 = current_opl_core == 3;
  }
  this->IsOPL3 = local_39;
  memset(this->chips,0,0x40);
  i = numchips;
  if ((this->IsOPL3 & 1U) != 0) {
    i = numchips + 1 >> 1;
  }
  for (chip._4_4_ = 0; chip._4_4_ < i; chip._4_4_ = chip._4_4_ + 1) {
    if ((this->IsOPL3 & 1U) == 0) {
      local_58 = YM3812Create(stereo);
    }
    else {
      if (current_opl_core == 1) {
        local_48 = DBOPLCreate(stereo);
      }
      else {
        if (current_opl_core == 2) {
          local_50 = JavaOPLCreate(stereo);
        }
        else {
          local_50 = NukedOPL3Create(stereo);
        }
        local_48 = local_50;
      }
      local_58 = local_48;
    }
    if (local_58 == (OPLEmul *)0x0) break;
    this->chips[chip._4_4_] = local_58;
  }
  this->NumChips = chip._4_4_;
  iVar1 = 9;
  if ((this->IsOPL3 & 1U) != 0) {
    iVar1 = 0x12;
  }
  this->OPLchannels = chip._4_4_ * iVar1;
  OPLwriteInitState(this,initopl3);
  return chip._4_4_;
}

Assistant:

int OPLio::OPLinit(uint numchips, bool stereo, bool initopl3)
{
	assert(numchips >= 1 && numchips <= countof(chips));
	uint i;
	IsOPL3 = (current_opl_core == 1 || current_opl_core == 2 || current_opl_core == 3);

	memset(chips, 0, sizeof(chips));
	if (IsOPL3)
	{
		numchips = (numchips + 1) >> 1;
	}
	for (i = 0; i < numchips; ++i)
	{
		OPLEmul *chip = IsOPL3 ? (current_opl_core == 1 ? DBOPLCreate(stereo) : (current_opl_core == 2 ? JavaOPLCreate(stereo) : NukedOPL3Create(stereo))) : YM3812Create(stereo);
		if (chip == NULL)
		{
			break;
		}
		chips[i] = chip;
	}
	NumChips = i;
	OPLchannels = i * (IsOPL3 ? OPL3CHANNELS : OPL2CHANNELS);
	OPLwriteInitState(initopl3);
	return i;
}